

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_ref.c
# Opt level: O0

void rxa2_fill_segment(argon2_instance_t *instance,argon2_position_t position)

{
  uint32_t uVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  argon2_instance_t *in_RDI;
  int data_independent_addressing;
  uint32_t i;
  uint32_t starting_index;
  uint32_t curr_offset;
  uint32_t prev_offset;
  uint64_t ref_lane;
  uint64_t ref_index;
  uint64_t pseudo_rand;
  block zero_block;
  block input_block;
  block address_block;
  block *curr_block;
  block *ref_block;
  undefined2 in_stack_fffffffffffff3a8;
  undefined1 in_stack_fffffffffffff3aa;
  bool bVar2;
  uint uVar3;
  uint8_t in;
  undefined4 in_stack_fffffffffffff3b0;
  undefined4 in_stack_fffffffffffff3b4;
  uint uVar4;
  uint uVar5;
  uint local_c48;
  uint local_c44;
  ulong local_c40;
  ulong local_c30;
  int in_stack_fffffffffffffbac;
  block *in_stack_fffffffffffffbb0;
  block *in_stack_fffffffffffffbb8;
  block *in_stack_fffffffffffffbc0;
  ulong local_428 [128];
  block *local_28;
  block *local_20;
  argon2_instance_t *local_18;
  argon2_position_t local_10;
  
  local_20 = (block *)0x0;
  local_28 = (block *)0x0;
  if (in_RDI != (argon2_instance_t *)0x0) {
    bVar2 = true;
    if ((in_RDI->type != Argon2_i) &&
       (in_stack_fffffffffffff3aa = false, bVar2 = (bool)in_stack_fffffffffffff3aa,
       in_RDI->type == Argon2_id)) {
      local_10.pass = (uint32_t)in_RSI;
      in_stack_fffffffffffff3aa = false;
      bVar2 = (bool)in_stack_fffffffffffff3aa;
      if (local_10.pass == 0) {
        local_10.slice = (uint8_t)in_RDX;
        in_stack_fffffffffffff3aa = local_10.slice < 2;
        bVar2 = (bool)in_stack_fffffffffffff3aa;
      }
    }
    uVar3 = (uint)CONCAT11(bVar2,bVar2);
    in = '\0';
    local_18 = in_RDI;
    local_10._0_8_ = in_RSI;
    local_10._8_8_ = in_RDX;
    if (bVar2 != false) {
      rxa2_init_block_value
                ((block *)CONCAT44(in_stack_fffffffffffff3b4,in_stack_fffffffffffff3b0),'\0');
      rxa2_init_block_value
                ((block *)CONCAT44(in_stack_fffffffffffff3b4,in_stack_fffffffffffff3b0),in);
    }
    uVar4 = 0;
    if (((local_10.pass == 0) && (local_10.slice == '\0')) &&
       (uVar4 = 2, CONCAT13(in,(int3)(uVar3 >> 8)) != 0)) {
      next_addresses((block *)CONCAT44(2,in_stack_fffffffffffff3b0),
                     (block *)CONCAT17(in,CONCAT43(uVar3,CONCAT12(in_stack_fffffffffffff3aa,
                                                                  in_stack_fffffffffffff3a8))),
                     (block *)0x15334d);
    }
    local_c48 = local_10.lane * local_18->lane_length +
                (uint)local_10.slice * local_18->segment_length + uVar4;
    local_c44 = local_c48;
    if (local_c48 % local_18->lane_length == 0) {
      local_c44 = local_c48 + local_18->lane_length;
    }
    local_c44 = local_c44 - 1;
    uVar5 = uVar4;
    for (; uVar4 < local_18->segment_length; uVar4 = uVar4 + 1) {
      if (local_c48 % local_18->lane_length == 1) {
        local_c44 = local_c48 - 1;
      }
      if (CONCAT13(in,(int3)(uVar3 >> 8)) == 0) {
        local_c30 = local_18->memory[local_c44].v[0];
      }
      else {
        if ((uVar4 & 0x7f) == 0) {
          next_addresses((block *)CONCAT44(uVar5,uVar4),
                         (block *)CONCAT17(in,CONCAT43(uVar3,CONCAT12(in_stack_fffffffffffff3aa,
                                                                      in_stack_fffffffffffff3a8))),
                         (block *)0x153425);
        }
        local_c30 = local_428[uVar4 & 0x7f];
      }
      local_c40 = (local_c30 >> 0x20) % (ulong)local_18->lanes;
      if ((local_10.pass == 0) && (local_10.slice == '\0')) {
        local_c40 = (ulong)local_10.lane;
      }
      local_10.index = uVar4;
      uVar1 = rxa2_index_alpha(local_18,&local_10,(uint32_t)local_c30,
                               (uint)(local_c40 == local_10.lane));
      local_20 = local_18->memory + local_18->lane_length * local_c40 + (ulong)uVar1;
      local_28 = local_18->memory + local_c48;
      if (local_18->version == 0x10) {
        fill_block(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                   in_stack_fffffffffffffbac);
      }
      else if (local_10.pass == 0) {
        fill_block(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                   in_stack_fffffffffffffbac);
      }
      else {
        fill_block(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
                   in_stack_fffffffffffffbac);
      }
      local_c48 = local_c48 + 1;
      local_c44 = local_c44 + 1;
    }
  }
  return;
}

Assistant:

void rxa2_fill_segment(const argon2_instance_t *instance,
	argon2_position_t position) {
	block *ref_block = NULL, *curr_block = NULL;
	block address_block, input_block, zero_block;
	uint64_t pseudo_rand, ref_index, ref_lane;
	uint32_t prev_offset, curr_offset;
	uint32_t starting_index;
	uint32_t i;
	int data_independent_addressing;

	if (instance == NULL) {
		return;
	}

	data_independent_addressing =
		(instance->type == Argon2_i) ||
		(instance->type == Argon2_id && (position.pass == 0) &&
		(position.slice < ARGON2_SYNC_POINTS / 2));

	if (data_independent_addressing) {
		rxa2_init_block_value(&zero_block, 0);
		rxa2_init_block_value(&input_block, 0);

		input_block.v[0] = position.pass;
		input_block.v[1] = position.lane;
		input_block.v[2] = position.slice;
		input_block.v[3] = instance->memory_blocks;
		input_block.v[4] = instance->passes;
		input_block.v[5] = instance->type;
	}

	starting_index = 0;

	if ((0 == position.pass) && (0 == position.slice)) {
		starting_index = 2; /* we have already generated the first two blocks */

		/* Don't forget to generate the first block of addresses: */
		if (data_independent_addressing) {
			next_addresses(&address_block, &input_block, &zero_block);
		}
	}

	/* Offset of the current block */
	curr_offset = position.lane * instance->lane_length +
		position.slice * instance->segment_length + starting_index;

	if (0 == curr_offset % instance->lane_length) {
		/* Last block in this lane */
		prev_offset = curr_offset + instance->lane_length - 1;
	}
	else {
		/* Previous block */
		prev_offset = curr_offset - 1;
	}

	for (i = starting_index; i < instance->segment_length;
		++i, ++curr_offset, ++prev_offset) {
		/*1.1 Rotating prev_offset if needed */
		if (curr_offset % instance->lane_length == 1) {
			prev_offset = curr_offset - 1;
		}

		/* 1.2 Computing the index of the reference block */
		/* 1.2.1 Taking pseudo-random value from the previous block */
		if (data_independent_addressing) {
			if (i % ARGON2_ADDRESSES_IN_BLOCK == 0) {
				next_addresses(&address_block, &input_block, &zero_block);
			}
			pseudo_rand = address_block.v[i % ARGON2_ADDRESSES_IN_BLOCK];
		}
		else {
			pseudo_rand = instance->memory[prev_offset].v[0];
		}

		/* 1.2.2 Computing the lane of the reference block */
		ref_lane = ((pseudo_rand >> 32)) % instance->lanes;

		if ((position.pass == 0) && (position.slice == 0)) {
			/* Can not reference other lanes yet */
			ref_lane = position.lane;
		}

		/* 1.2.3 Computing the number of possible reference block within the
		 * lane.
		 */
		position.index = i;
		ref_index = rxa2_index_alpha(instance, &position, pseudo_rand & 0xFFFFFFFF,
			ref_lane == position.lane);

		/* 2 Creating a new block */
		ref_block =
			instance->memory + instance->lane_length * ref_lane + ref_index;
		curr_block = instance->memory + curr_offset;
		if (ARGON2_VERSION_10 == instance->version) {
			/* version 1.2.1 and earlier: overwrite, not XOR */
			fill_block(instance->memory + prev_offset, ref_block, curr_block, 0);
		}
		else {
			if (0 == position.pass) {
				fill_block(instance->memory + prev_offset, ref_block,
					curr_block, 0);
			}
			else {
				fill_block(instance->memory + prev_offset, ref_block,
					curr_block, 1);
			}
		}
	}
}